

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * tinyfd_openFileDialog
                 (char *aTitle,char *aDefaultPathAndFile,int aNumOfFilterPatterns,
                 char **aFilterPatterns,char *aSingleFilterDescription,int aAllowMultipleSelects)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  undefined4 uVar11;
  size_t sStack_850;
  char lDialogString [1024];
  char lString [1024];
  
  tinyfd_openFileDialog::lBuff[0] = '\0';
  iVar2 = osascriptPresent();
  uVar7 = (ulong)(uint)aNumOfFilterPatterns;
  if (iVar2 == 0) {
    iVar2 = kdialogPresent();
    uVar9 = 0x676f6c6169646b;
    if (iVar2 != 0) {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
LAB_001161b0:
        tinyfd_response._0_4_ = (undefined4)uVar9;
        tinyfd_response._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
        tinyfd_response[6] = (char)((ulong)uVar9 >> 0x30);
        tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
        return (char *)0x1;
      }
      builtin_strncpy(lDialogString,"kdialog",8);
      iVar2 = kdialogPresent();
      if (iVar2 == 2) {
        sVar4 = strlen(lDialogString);
        memcpy(lDialogString + sVar4,
               " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
      }
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --getopenfilename ",0x14);
      if ((aDefaultPathAndFile == (char *)0x0) || (*aDefaultPathAndFile == '\0')) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
      }
      else {
        if (*aDefaultPathAndFile != '/') {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
        }
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = '\0';
        strcat(lDialogString,aDefaultPathAndFile);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = '\0';
      }
      if (0 < aNumOfFilterPatterns) {
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = ' ';
        (lDialogString + sVar4)[1] = '\"';
        lDialogString[sVar4 + 2] = '\0';
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          strcat(lDialogString,aFilterPatterns[uVar8]);
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = ' ';
          (lDialogString + sVar4)[1] = '\0';
        }
        if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4," | ",4);
          strcat(lDialogString,aSingleFilterDescription);
        }
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = '\0';
      }
      if (aAllowMultipleSelects != 0) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4," --multiple --separate-output",0x1e);
      }
      bVar1 = true;
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4," --title \"",0xb);
        strcat(lDialogString,aTitle);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = '\0';
      }
      goto LAB_001156c8;
    }
    iVar2 = zenityPresent();
    if ((iVar2 == 0) && (iVar2 = matedialogPresent(), iVar2 == 0)) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      iVar2 = qarmaPresent();
      if (iVar2 == 0) {
        iVar2 = tkinter2Present();
        if (iVar2 == 0) {
          iVar2 = tkinter3Present();
          if (iVar2 == 0) {
            iVar2 = xdialogPresent();
            if ((iVar2 == 0) && (pcVar10 = dialogName(), pcVar10 == (char *)0x0)) {
              if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
                pcVar10 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar10;
              }
              pcVar10 = tinyfd_inputBox(aTitle,"Open file","");
              iVar2 = fileExists(pcVar10);
              if (iVar2 == 0) {
                return (char *)0x0;
              }
              return pcVar10;
            }
            iVar2 = xdialogPresent();
            if (iVar2 == 0) {
              iVar3 = isTerminalRunning();
              if (iVar3 == 0) {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  builtin_strncpy(tinyfd_response,"dialog",7);
                  return (char *)0x0;
                }
                pcVar10 = terminalName();
                strcpy(lDialogString,pcVar10);
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = '\'';
                (lDialogString + sVar4)[1] = '(';
                lDialogString[sVar4 + 2] = '\0';
                pcVar10 = dialogName();
                strcat(lDialogString,pcVar10);
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = ' ';
                (lDialogString + sVar4)[1] = '\0';
                bVar1 = false;
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  builtin_strncpy(tinyfd_response,"dialog",7);
                  return (char *)0x0;
                }
                builtin_strncpy(lDialogString,"(dialog ",9);
                bVar1 = true;
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                uVar9 = 0x676f6c61696478;
                goto LAB_001161b0;
              }
              builtin_strncpy(lDialogString,"(Xdialog ",10);
              bVar1 = true;
            }
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"--title \"",10);
              strcat(lDialogString,aTitle);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\"';
              (lDialogString + sVar4)[1] = ' ';
              lDialogString[sVar4 + 2] = '\0';
            }
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (iVar3 = gdialogPresent(), iVar3 == 0)) {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"--backtitle \"",0xe);
              sVar4 = strlen(lDialogString);
              memcpy(lDialogString + sVar4,
                     "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY",
                     0x4b);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\"';
              (lDialogString + sVar4)[1] = ' ';
              lDialogString[sVar4 + 2] = '\0';
            }
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"--fselect \"",0xc);
            if ((aDefaultPathAndFile == (char *)0x0) || (*aDefaultPathAndFile == '\0')) {
              iVar3 = isTerminalRunning();
              if (iVar3 == 0 && iVar2 == 0) {
                pcVar10 = getenv("HOME");
                strcat(lDialogString,pcVar10);
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = '/';
                (lDialogString + sVar4)[1] = '\0';
              }
              else {
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = '.';
                (lDialogString + sVar4)[1] = '/';
                lDialogString[sVar4 + 2] = '\0';
              }
            }
            else {
              pcVar10 = strchr(aDefaultPathAndFile,0x2f);
              if (pcVar10 == (char *)0x0) {
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = '.';
                (lDialogString + sVar4)[1] = '/';
                lDialogString[sVar4 + 2] = '\0';
              }
              strcat(lDialogString,aDefaultPathAndFile);
            }
            sVar4 = strlen(lDialogString);
            if (iVar2 == 0) {
              builtin_strncpy(lDialogString + sVar4,"\" 0 60  >/dev/tty) ",0x14);
              sVar4 = strlen(lDialogString);
              if (bVar1) {
                builtin_strncpy(lDialogString + sVar4,"2>&1 ; clear >/dev/tty",0x17);
              }
              else {
                builtin_strncpy(lDialogString + sVar4,
                                "2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt",0x3a);
              }
            }
            else {
              builtin_strncpy(lDialogString + sVar4,"\" 0 60 ) 2>&1 ",0xf);
            }
            goto LAB_001156c6;
          }
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            uVar11._0_1_ = 'o';
            uVar11._1_1_ = 'n';
            uVar11._2_1_ = '3';
            uVar11._3_1_ = '-';
            goto LAB_00115f2e;
          }
          strcpy(lDialogString,gPython3Name);
          sVar4 = strlen(lDialogString);
          memcpy(lDialogString + sVar4,
                 " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                 ,0x59);
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"lFiles=filedialog.askopenfilename(",0x23);
          if (aAllowMultipleSelects != 0) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"multiple=1,",0xc);
          }
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"title=\'",8);
            strcat(lDialogString,aTitle);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
            getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
            if (lString[0] != '\0') {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
              strcat(lDialogString,lString);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
            getLastName(lString,aDefaultPathAndFile);
            if (lString[0] != '\0') {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialfile=\'",0xe);
              strcat(lDialogString,lString);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
          }
          if ((1 < aNumOfFilterPatterns) ||
             ((aNumOfFilterPatterns == 1 &&
              (pcVar10 = *aFilterPatterns, sVar4 = strlen(pcVar10), pcVar10[sVar4 - 1] != '*')))) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"filetypes=(",0xc);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '(';
            (lDialogString + sVar4)[1] = '\'';
            lDialogString[sVar4 + 2] = '\0';
            if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
              strcat(lDialogString,aSingleFilterDescription);
            }
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"\',(",4);
            for (uVar8 = 0; sVar4 = strlen(lDialogString), uVar7 != uVar8; uVar8 = uVar8 + 1) {
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = '\0';
              strcat(lDialogString,aFilterPatterns[uVar8]);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
            builtin_strncpy(lDialogString + sVar4,")),",4);
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"(\'All files\',\'*\'))",0x13);
          }
          sVar4 = strlen(lDialogString);
          pcVar10 = 
          ");\nif not isinstance(lFiles, tuple):\n\tprint(lFiles)\nelse:\n\tlFilesString=\'\'\n\tfor lFile in lFiles:\n\t\tlFilesString+=str(lFile)+\'|\'\n\tprint(lFilesString[:-1])\n\""
          ;
          __n = 0x9c;
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
            uVar11._0_1_ = 'o';
            uVar11._1_1_ = 'n';
            uVar11._2_1_ = '2';
            uVar11._3_1_ = '-';
LAB_00115f2e:
            tinyfd_response._4_2_ = (undefined2)uVar11;
            tinyfd_response[6] = SUB41(uVar11,2);
            builtin_strncpy(tinyfd_response + 8,"tkinter",8);
            tinyfd_response[7] = SUB41(uVar11,3);
            builtin_strncpy(tinyfd_response,"pyth",4);
            return (char *)0x1;
          }
          strcpy(lDialogString,gPython2Name);
          iVar2 = isTerminalRunning();
          if ((iVar2 == 0) && (iVar2 = isDarwin(), iVar2 != 0)) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4," -i",4);
          }
          sVar4 = strlen(lDialogString);
          memcpy(lDialogString + sVar4,
                 " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();",0x47);
          iVar2 = isDarwin();
          if (iVar2 != 0) {
            sVar4 = strlen(lDialogString);
            memcpy(lDialogString + sVar4,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                   ,0x78);
          }
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"lFiles=tkFileDialog.askopenfilename(",0x25);
          if (aAllowMultipleSelects != 0) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"multiple=1,",0xc);
          }
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"title=\'",8);
            strcat(lDialogString,aTitle);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\'';
            (lDialogString + sVar4)[1] = ',';
            lDialogString[sVar4 + 2] = '\0';
          }
          if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
            getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
            if (lString[0] != '\0') {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
              strcat(lDialogString,lString);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
            getLastName(lString,aDefaultPathAndFile);
            if (lString[0] != '\0') {
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialfile=\'",0xe);
              strcat(lDialogString,lString);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
          }
          if ((1 < aNumOfFilterPatterns) ||
             ((aNumOfFilterPatterns == 1 &&
              (pcVar10 = *aFilterPatterns, sVar4 = strlen(pcVar10), pcVar10[sVar4 - 1] != '*')))) {
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"filetypes=(",0xc);
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '(';
            (lDialogString + sVar4)[1] = '\'';
            lDialogString[sVar4 + 2] = '\0';
            if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
              strcat(lDialogString,aSingleFilterDescription);
            }
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"\',(",4);
            for (uVar8 = 0; sVar4 = strlen(lDialogString), uVar7 != uVar8; uVar8 = uVar8 + 1) {
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = '\0';
              strcat(lDialogString,aFilterPatterns[uVar8]);
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
            builtin_strncpy(lDialogString + sVar4,")),",4);
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"(\'All files\',\'*\'))",0x13);
          }
          sVar4 = strlen(lDialogString);
          pcVar10 = 
          ");\nif not isinstance(lFiles, tuple):\n\tprint lFiles\nelse:\n\tlFilesString=\'\'\n\tfor lFile in lFiles:\n\t\tlFilesString+=str(lFile)+\'|\'\n\tprint lFilesString[:-1]\n\""
          ;
          __n = 0x9a;
        }
        memcpy(lDialogString + sVar4,pcVar10,__n);
        goto LAB_001156c6;
      }
    }
    iVar2 = zenityPresent();
    if (iVar2 == 0) {
      iVar2 = matedialogPresent();
      if (iVar2 == 0) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response,"qarma",6);
          return (char *)0x1;
        }
        builtin_strncpy(lDialogString,"qarma",6);
        pcVar10 = getenv("SSH_TTY");
        if (pcVar10 == (char *)0x0) {
          sVar4 = strlen(lDialogString);
          pcVar10 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          sStack_850 = 0x41;
          goto LAB_00115511;
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response,"matedialog",0xb);
          return (char *)0x1;
        }
        builtin_strncpy(lDialogString,"matedialog",0xb);
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"zenity",7);
        return (char *)0x1;
      }
      builtin_strncpy(lDialogString,"zenity",7);
      iVar2 = zenity3Present();
      if ((3 < iVar2) && (pcVar10 = getenv("SSH_TTY"), pcVar10 == (char *)0x0)) {
        sVar4 = strlen(lDialogString);
        pcVar10 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        sStack_850 = 0x4b;
LAB_00115511:
        memcpy(lDialogString + sVar4,pcVar10,sStack_850);
      }
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --file-selection",0x12);
    if (aAllowMultipleSelects != 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --multiple",0xc);
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --title=\"",0xb);
      strcat(lDialogString,aTitle);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    if ((aDefaultPathAndFile != (char *)0x0) && (*aDefaultPathAndFile != '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --filename=\"",0xe);
      strcat(lDialogString,aDefaultPathAndFile);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    if (0 < aNumOfFilterPatterns) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --file-filter=\'",0x11);
      if ((aSingleFilterDescription != (char *)0x0) && (*aSingleFilterDescription != '\0')) {
        strcat(lDialogString,aSingleFilterDescription);
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4," | ",4);
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        strcat(lDialogString,aFilterPatterns[uVar8]);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = ' ';
        (lDialogString + sVar4)[1] = '\0';
      }
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"\' --file-filter=\'All files | *\'",0x20);
    }
    if (tinyfd_silent != 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," 2>/dev/null ",0xe);
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(lDialogString,"osascript ",0xb);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,
                      " -e \'tell application \"System Events\"\' -e \'Activate\'",0x35);
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," -e \'try\' -e \'",0xf);
    sVar4 = strlen(lDialogString);
    if (aAllowMultipleSelects == 0) {
      builtin_strncpy(lDialogString + sVar4,"POSIX path of ( ",0x11);
    }
    else {
      builtin_strncpy(lDialogString + sVar4,"set mylist to ",0xf);
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"choose file ",0xd);
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"with prompt \"",0xe);
      strcat(lDialogString,aTitle);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    getPathWithoutFinalSlash(lString,aDefaultPathAndFile);
    if (lString[0] != '\0') {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"default location \"",0x13);
      strcat(lDialogString,lString);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    if (0 < aNumOfFilterPatterns) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"of type {\"",0xb);
      strcat(lDialogString,*aFilterPatterns + 2);
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
      uVar8 = 1;
      while( true ) {
        sVar4 = strlen(lDialogString);
        pcVar10 = lDialogString + sVar4;
        if (uVar7 == uVar8) break;
        lDialogString[sVar4 + 2] = '\0';
        pcVar10[0] = ',';
        pcVar10[1] = '\"';
        strcat(lDialogString,aFilterPatterns[uVar8] + 2);
        sVar4 = strlen(lDialogString);
        (lDialogString + sVar4)[0] = '\"';
        (lDialogString + sVar4)[1] = '\0';
        uVar8 = uVar8 + 1;
      }
      lDialogString[sVar4 + 2] = '\0';
      pcVar10[0] = '}';
      pcVar10[1] = ' ';
    }
    sVar4 = strlen(lDialogString);
    if (aAllowMultipleSelects == 0) {
      builtin_strncpy(lDialogString + sVar4,")\' ",4);
    }
    else {
      builtin_strncpy(lDialogString + sVar4,"multiple selections allowed true \' ",0x24);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"-e \'set mystring to POSIX path of item 1 of mylist\' "
                      ,0x35);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"-e \'repeat with  i from 2 to the count of mylist\' ",
                      0x33);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"-e \'set mystring to mystring & \"|\"\' ",0x25);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,
                      "-e \'set mystring to mystring & POSIX path of item i of mylist\' ",0x40);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"-e \'end repeat\' ",0x11);
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"-e \'mystring\' ",0xf);
    }
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'on error number -128\' ",0x1b);
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'end try\'",0xd);
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," -e \'end tell\'",0xf);
    }
  }
LAB_001156c6:
  bVar1 = false;
LAB_001156c8:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lDialogString);
  }
  __stream = popen(lDialogString,"r");
  if (__stream != (FILE *)0x0) {
    tinyfd_openFileDialog::lBuff[0] = '\0';
    pcVar10 = tinyfd_openFileDialog::lBuff;
    while (pcVar5 = fgets(pcVar10,0x8000,__stream), pcVar5 != (char *)0x0) {
      sVar4 = strlen(pcVar10);
      pcVar10 = pcVar10 + sVar4;
    }
    pclose(__stream);
    sVar4 = strlen(tinyfd_openFileDialog::lBuff);
    if (tinyfd_saveFileDialog::lBuff[sVar4 + 0x3ff] == '\n') {
      tinyfd_saveFileDialog::lBuff[sVar4 + 0x3ff] = '\0';
    }
    if (bVar1 && aAllowMultipleSelects != 0) {
      pcVar10 = tinyfd_openFileDialog::lBuff;
      while (pcVar10 = strchr(pcVar10,10), pcVar10 != (char *)0x0) {
        *pcVar10 = '|';
      }
    }
    if (tinyfd_openFileDialog::lBuff[0] != '\0') {
      if (aAllowMultipleSelects != 0) {
        pcVar5 = tinyfd_openFileDialog::lBuff;
        pcVar10 = strchr(tinyfd_openFileDialog::lBuff,0x7c);
        if (pcVar10 != (char *)0x0) {
          pcVar10 = tinyfd_openFileDialog::lBuff;
          while (pcVar6 = strchr(pcVar10,0x7c), pcVar6 != (char *)0x0) {
            sVar4 = (long)pcVar6 - (long)pcVar10;
            memmove(pcVar5,pcVar10,sVar4);
            pcVar5[sVar4] = '\0';
            iVar2 = fileExists(pcVar5);
            if (iVar2 != 0) {
              pcVar5[sVar4] = '|';
              pcVar5 = pcVar5 + sVar4 + 1;
            }
            pcVar10 = pcVar6 + 1;
          }
          iVar2 = fileExists(pcVar10);
          if (iVar2 == 0) {
            sVar4 = 0xffffffffffffffff;
          }
          else {
            sVar4 = strlen(pcVar10);
            memmove(pcVar5,pcVar10,sVar4);
          }
          pcVar5[sVar4] = '\0';
          return tinyfd_openFileDialog::lBuff;
        }
      }
      iVar2 = fileExists(tinyfd_openFileDialog::lBuff);
      if (iVar2 == 0) {
        return (char *)0x0;
      }
      return tinyfd_openFileDialog::lBuff;
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_openFileDialog(
    char const * const aTitle , /* NULL or "" */
    char const * const aDefaultPathAndFile , /* NULL or "" */
    int const aNumOfFilterPatterns , /* 0 */
    char const * const * const aFilterPatterns , /* NULL or {"*.jpg","*.png"} */
    char const * const aSingleFilterDescription , /* NULL or "image files" */
    int const aAllowMultipleSelects ) /* 0 or 1 */
{
        static char lBuff[MAX_MULTIPLE_FILES*MAX_PATH_OR_CMD];
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        p = openFileDialogWinGui8(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns,
                                aFilterPatterns, aSingleFilterDescription, aAllowMultipleSelects);
                }
                else
                {
                        p = openFileDialogWinGuiA(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns,
                                aFilterPatterns, aSingleFilterDescription, aAllowMultipleSelects);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = openFileDialogWinConsole(lBuff,
                                aTitle,aDefaultPathAndFile,aAllowMultipleSelects);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Open file","");
        }

        if ( ! p || ! strlen( p )  )
        {
                return NULL;
        }
        if ( aAllowMultipleSelects && strchr(p, '|') )
        {
                p = ensureFilesExist( lBuff , p ) ;
        }
        else if ( ! fileExists(p) )
        {
                return NULL ;
        }
        /* printf( "lBuff3: %s\n" , p ) ; */
        return p ;
}